

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O2

void __thiscall
UnifiedRegex::RegexStacks::RegexStacks(RegexStacks *this,PageAllocator *pageAllocator)

{
  ContinuousPageStack<1UL>::ContinuousPageStack
            ((ContinuousPageStack<1UL> *)this,pageAllocator,Js::Throw::OutOfMemory);
  ContinuousPageStack<1UL>::ContinuousPageStack
            ((ContinuousPageStack<1UL> *)&this->assertionStack,pageAllocator,Js::Throw::OutOfMemory)
  ;
  return;
}

Assistant:

RegexStacks(PageAllocator * pageAllocator) :
            contStack(pageAllocator, Js::Throw::OutOfMemory),
            assertionStack(pageAllocator, Js::Throw::OutOfMemory) {}